

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# soul_Parser.h
# Opt level: O3

Op soul::StructuralParser::getOpForTypeMetaFunctionName(QualifiedIdentifier *qi)

{
  size_t sVar1;
  Op OVar2;
  IdentifierPath local_80;
  
  IdentifierPath::operator+
            (&local_80,&qi->pathPrefix,
             &((qi->pathSections).
               super__Vector_base<soul::AST::QualifiedIdentifier::PathSection,_std::allocator<soul::AST::QualifiedIdentifier::PathSection>_>
               ._M_impl.super__Vector_impl_data._M_start)->path);
  sVar1 = local_80.pathSections.numActive;
  local_80.pathSections.numActive = 0;
  if ((8 < local_80.pathSections.numAllocated) && (local_80.pathSections.items != (Identifier *)0x0)
     ) {
    operator_delete__(local_80.pathSections.items);
  }
  OVar2 = none;
  if (sVar1 == 1) {
    IdentifierPath::operator+
              (&local_80,&qi->pathPrefix,
               &((qi->pathSections).
                 super__Vector_base<soul::AST::QualifiedIdentifier::PathSection,_std::allocator<soul::AST::QualifiedIdentifier::PathSection>_>
                 ._M_impl.super__Vector_impl_data._M_start)->path);
    if (local_80.pathSections.numActive == 0) {
      throwInternalCompilerError("! empty()","front",0xa8);
    }
    OVar2 = AST::TypeMetaFunction::getOperationForName((Identifier)0x1f433a);
    local_80.pathSections.numActive = 0;
    if ((8 < local_80.pathSections.numAllocated) &&
       (local_80.pathSections.items != (Identifier *)0x0)) {
      operator_delete__(local_80.pathSections.items);
    }
  }
  return OVar2;
}

Assistant:

static AST::TypeMetaFunction::Op getOpForTypeMetaFunctionName (const AST::QualifiedIdentifier& qi)
    {
        if (qi.getPath().isUnqualified())
            return AST::TypeMetaFunction::getOperationForName (qi.getPath().getFirstPart());

        return AST::TypeMetaFunction::Op::none;
    }